

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O0

HTS_Boolean HTS_Engine_synthesize(HTS_Engine *engine)

{
  HTS_Boolean HVar1;
  HTS_Engine *in_stack_00000018;
  HTS_Engine *in_stack_00000050;
  undefined1 local_1;
  
  HVar1 = HTS_Engine_generate_state_sequence(in_stack_00000018);
  if (HVar1 == '\x01') {
    HVar1 = HTS_Engine_generate_parameter_sequence((HTS_Engine *)0x103556);
    if (HVar1 == '\x01') {
      HVar1 = HTS_Engine_generate_sample_sequence(in_stack_00000050);
      if (HVar1 == '\x01') {
        local_1 = '\x01';
      }
      else {
        HTS_Engine_refresh((HTS_Engine *)0x10358b);
        local_1 = '\0';
      }
    }
    else {
      HTS_Engine_refresh((HTS_Engine *)0x103568);
      local_1 = '\0';
    }
  }
  else {
    HTS_Engine_refresh((HTS_Engine *)0x103545);
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static HTS_Boolean HTS_Engine_synthesize(HTS_Engine * engine)
{
   if (HTS_Engine_generate_state_sequence(engine) != TRUE) {
      HTS_Engine_refresh(engine);
      return FALSE;
   }
   if (HTS_Engine_generate_parameter_sequence(engine) != TRUE) {
      HTS_Engine_refresh(engine);
      return FALSE;
   }
   if (HTS_Engine_generate_sample_sequence(engine) != TRUE) {
      HTS_Engine_refresh(engine);
      return FALSE;
   }
   return TRUE;
}